

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_op.h
# Opt level: O2

string * absl::lts_20240722::log_internal::MakeCheckOpString<unsigned_long,unsigned_long>
                   (unsigned_long v1,unsigned_long v2,char *exprtext)

{
  string *psVar1;
  CheckOpMessageBuilder comb;
  CheckOpMessageBuilder local_190;
  
  CheckOpMessageBuilder::CheckOpMessageBuilder(&local_190,exprtext);
  std::ostream::_M_insert<unsigned_long>((ulong)&local_190);
  CheckOpMessageBuilder::ForVar2(&local_190);
  std::ostream::_M_insert<unsigned_long>((ulong)&local_190);
  psVar1 = CheckOpMessageBuilder::NewString_abi_cxx11_(&local_190);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190);
  return psVar1;
}

Assistant:

std::string* MakeCheckOpString(T1 v1, T2 v2, const char* exprtext) {
  CheckOpMessageBuilder comb(exprtext);
  MakeCheckOpValueString(comb.ForVar1(), v1);
  MakeCheckOpValueString(comb.ForVar2(), v2);
  return comb.NewString();
}